

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lasindex.cpp
# Opt level: O3

ssize_t __thiscall LASindex::write(LASindex *this,int __fd,void *__buf,size_t __n)

{
  char cVar1;
  ssize_t sVar2;
  void *__buf_00;
  void *__buf_01;
  ulong uVar3;
  undefined4 in_register_00000034;
  long *plVar4;
  char *pcVar5;
  U32 version;
  
  plVar4 = (long *)CONCAT44(in_register_00000034,__fd);
  cVar1 = (**(code **)(*plVar4 + 8))(plVar4,"LASX",4);
  if (cVar1 == '\0') {
    pcVar5 = "(LASindex): writing signature";
LAB_00120cbb:
    uVar3 = 0;
    LASMessage(LAS_ERROR,pcVar5);
    if (halt_on_error != true) goto LAB_00120cdc;
  }
  else {
    cVar1 = (**(code **)(*plVar4 + 0x18))(plVar4);
    if (cVar1 == '\0') {
      pcVar5 = "(LASindex): writing version";
    }
    else {
      sVar2 = LASquadtree::write(this->spatial,__fd,__buf_00,__n);
      if ((char)sVar2 != '\0') {
        sVar2 = LASinterval::write(this->interval,__fd,__buf_01,__n);
        uVar3 = CONCAT71((int7)((ulong)plVar4 >> 8),1);
        if ((char)sVar2 != '\0') goto LAB_00120cdc;
        pcVar5 = "(LASindex): writing LASinterval";
        goto LAB_00120cbb;
      }
      pcVar5 = "(LASindex): cannot write LASspatial (LASquadtree)";
    }
    uVar3 = 0;
    LASMessage(LAS_ERROR,pcVar5);
    if (halt_on_error == false) goto LAB_00120cdc;
  }
  byebye();
  uVar3 = 0;
LAB_00120cdc:
  return uVar3 & 0xffffffff;
}

Assistant:

BOOL LASindex::write(ByteStreamOut* stream) const
{
  if (!stream->putBytes((const U8*)"LASX", 4))
  {
    laserror("(LASindex): writing signature");
    return FALSE;
  }
  U32 version = 0;
  if (!stream->put32bitsLE((const U8*)&version))
  {
    laserror("(LASindex): writing version");
    return FALSE;
  }
  // write spatial quadtree
  if (!spatial->write(stream))
  {
    laserror("(LASindex): cannot write LASspatial (LASquadtree)");
    return FALSE;
  }
  // write interval
  if (!interval->write(stream))
  {
    laserror("(LASindex): writing LASinterval");
    return FALSE;
  }
  return TRUE;
}